

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::setState
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DataFlowState *newState)

{
  long in_RDI;
  DataFlowState *in_stack_fffffffffffffe58;
  DataFlowState *other;
  DataFlowState *in_stack_fffffffffffffe60;
  DataFlowState *this_00;
  
  *(undefined1 *)(in_RDI + 0x550) = 0;
  DataFlowState::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  DataFlowState::DataFlowState(in_stack_fffffffffffffe60);
  DataFlowState::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  DataFlowState::~DataFlowState((DataFlowState *)0x7f1ff6);
  other = (DataFlowState *)0x0;
  this_00 = (DataFlowState *)0x0;
  DataFlowState::DataFlowState((DataFlowState *)0x0);
  DataFlowState::operator=(this_00,other);
  DataFlowState::~DataFlowState((DataFlowState *)0x7f2072);
  return;
}

Assistant:

void setState(TState newState) {
        isStateSplit = false;
        state = std::move(newState);
        stateWhenTrue = {};
        stateWhenFalse = {};
    }